

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

void __thiscall
cmELFInternalImpl<cmELFTypes32>::PrintInfo(cmELFInternalImpl<cmELFTypes32> *this,ostream *os)

{
  ostream *poVar1;
  char *pcVar2;
  ostream *os_local;
  cmELFInternalImpl<cmELFTypes32> *this_local;
  
  poVar1 = std::operator<<(os,"ELF ");
  pcVar2 = cmELFTypes32::GetName();
  std::operator<<(poVar1,pcVar2);
  if ((this->super_cmELFInternal).ByteOrder == ByteOrderMSB) {
    std::operator<<(os," MSB");
  }
  else if ((this->super_cmELFInternal).ByteOrder == ByteOrderLSB) {
    std::operator<<(os," LSB");
  }
  switch((this->super_cmELFInternal).ELFType) {
  case FileTypeInvalid:
    std::operator<<(os," invalid file");
    break;
  case FileTypeRelocatableObject:
    std::operator<<(os," relocatable object");
    break;
  case FileTypeExecutable:
    std::operator<<(os," executable");
    break;
  case FileTypeSharedLibrary:
    std::operator<<(os," shared library");
    break;
  case FileTypeCore:
    std::operator<<(os," core file");
    break;
  case FileTypeSpecificOS:
    std::operator<<(os," os-specific type");
    break;
  case FileTypeSpecificProc:
    std::operator<<(os," processor-specific type");
  }
  std::operator<<(os,"\n");
  return;
}

Assistant:

void PrintInfo(std::ostream& os) const CM_OVERRIDE
  {
    os << "ELF " << Types::GetName();
    if (this->ByteOrder == ByteOrderMSB) {
      os << " MSB";
    } else if (this->ByteOrder == ByteOrderLSB) {
      os << " LSB";
    }
    switch (this->ELFType) {
      case cmELF::FileTypeInvalid:
        os << " invalid file";
        break;
      case cmELF::FileTypeRelocatableObject:
        os << " relocatable object";
        break;
      case cmELF::FileTypeExecutable:
        os << " executable";
        break;
      case cmELF::FileTypeSharedLibrary:
        os << " shared library";
        break;
      case cmELF::FileTypeCore:
        os << " core file";
        break;
      case cmELF::FileTypeSpecificOS:
        os << " os-specific type";
        break;
      case cmELF::FileTypeSpecificProc:
        os << " processor-specific type";
        break;
    }
    os << "\n";
  }